

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc.c
# Opt level: O0

void inproc_accept_clients(inproc_ep *srv)

{
  int iVar1;
  nni_aio *aio;
  inproc_pair *rc;
  void *pvVar2;
  int local_50;
  int local_4c;
  int i;
  int rv;
  nni_aio *saio;
  inproc_pair *pair;
  inproc_pipe *spipe;
  inproc_pipe *cpipe;
  nni_aio *caio;
  inproc_ep *nclient;
  inproc_ep *cli;
  inproc_ep *srv_local;
  
  cli = srv;
  caio = (nni_aio *)nni_list_first(&srv->clients);
  while (nclient = (inproc_ep *)caio, caio != (nni_aio *)0x0) {
    caio = (nni_aio *)nni_list_next(&cli->clients,caio);
    cpipe = (inproc_pipe *)nni_list_first(&nclient->aios);
    while ((cpipe != (inproc_pipe *)0x0 &&
           (aio = (nni_aio *)nni_list_first(&cli->aios), aio != (nni_aio *)0x0))) {
      rc = (inproc_pair *)nni_zalloc(0xd8);
      if (rc == (inproc_pair *)0x0) {
        inproc_conn_finish((nni_aio *)cpipe,2,nclient,(inproc_pipe *)0x0);
        inproc_conn_finish(aio,2,cli,(inproc_pipe *)0x0);
      }
      else {
        for (local_50 = 0; local_50 < 2; local_50 = local_50 + 1) {
          nni_aio_list_init(&rc->queues[local_50].readers);
          nni_aio_list_init(&rc->queues[local_50].writers);
          nni_mtx_init(&rc->queues[local_50].lock);
        }
        nni_refcnt_init((nni_refcnt *)rc,2,rc,inproc_pair_destroy);
        spipe = (inproc_pipe *)0x0;
        pair = (inproc_pair *)0x0;
        local_4c = nni_pipe_alloc_dialer(&spipe,nclient->dialer);
        if ((local_4c == 0) &&
           (local_4c = nni_pipe_alloc_listener(&pair,cli->listener), local_4c == 0)) {
          spipe->proto = nclient->proto;
          spipe->addr = nclient->addr;
          *(uint16_t *)((long)&pair->queues[0].readers.ll_head.ln_prev + 2) = cli->proto;
          *(char **)&pair->ref = cli->addr;
          spipe->peer = *(uint16_t *)((long)&pair->queues[0].readers.ll_head.ln_prev + 2);
          *(uint16_t *)&pair->queues[0].readers.ll_head.ln_prev = spipe->proto;
          spipe->pair = rc;
          (pair->ref).rc_fini = (_func_void_void_ptr *)rc;
          spipe->send_queue = rc->queues;
          spipe->recv_queue = rc->queues + 1;
          pair->queues[0].readers.ll_head.ln_next = (nni_list_node *)(rc->queues + 1);
          (pair->ref).rc_data = rc->queues;
          inproc_conn_finish((nni_aio *)cpipe,0,nclient,spipe);
          inproc_conn_finish(aio,0,cli,(inproc_pipe *)pair);
        }
        else {
          if (spipe == (inproc_pipe *)0x0) {
            nni_refcnt_rele((nni_refcnt *)rc);
          }
          else {
            nni_pipe_close(spipe->pipe);
            nni_pipe_rele(spipe->pipe);
          }
          if (pair == (inproc_pair *)0x0) {
            nni_refcnt_rele((nni_refcnt *)rc);
          }
          else {
            nni_pipe_close((nni_pipe *)pair->queues[0].readers.ll_offset);
            nni_pipe_rele((nni_pipe *)pair->queues[0].readers.ll_offset);
          }
          inproc_conn_finish((nni_aio *)cpipe,local_4c,nclient,(inproc_pipe *)0x0);
          inproc_conn_finish(aio,local_4c,cli,(inproc_pipe *)0x0);
        }
      }
      cpipe = (inproc_pipe *)nni_list_next(&nclient->aios,cpipe);
    }
    pvVar2 = nni_list_first(&nclient->aios);
    if ((pvVar2 == (void *)0x0) && (iVar1 = nni_list_active(&cli->clients,nclient), iVar1 != 0)) {
      nni_list_remove(&cli->clients,nclient);
    }
  }
  return;
}

Assistant:

static void
inproc_accept_clients(inproc_ep *srv)
{
	inproc_ep *cli, *nclient;

	nclient = nni_list_first(&srv->clients);
	while ((cli = nclient) != NULL) {
		nni_aio *caio;
		nclient = nni_list_next(&srv->clients, nclient);
		NNI_LIST_FOREACH (&cli->aios, caio) {

			inproc_pipe *cpipe;
			inproc_pipe *spipe;
			inproc_pair *pair;
			nni_aio     *saio;
			int          rv;

			if ((saio = nni_list_first(&srv->aios)) == NULL) {
				// No outstanding accept() calls.
				break;
			}

			if ((pair = NNI_ALLOC_STRUCT(pair)) == NULL) {
				inproc_conn_finish(
				    caio, NNG_ENOMEM, cli, NULL);
				inproc_conn_finish(
				    saio, NNG_ENOMEM, srv, NULL);
				continue;
			}
			for (int i = 0; i < 2; i++) {
				nni_aio_list_init(&pair->queues[i].readers);
				nni_aio_list_init(&pair->queues[i].writers);
				nni_mtx_init(&pair->queues[i].lock);
			}
			nni_refcnt_init(
			    &pair->ref, 2, pair, inproc_pair_destroy);

			spipe = cpipe = NULL;
			if (((rv = nni_pipe_alloc_dialer(
			          (void **) &cpipe, cli->dialer)) != 0) ||
			    ((rv = nni_pipe_alloc_listener(
			          (void **) &spipe, srv->listener)) != 0)) {

				if (cpipe != NULL) {
					nni_pipe_close(cpipe->pipe);
					nni_pipe_rele(cpipe->pipe);
				} else {
					nni_refcnt_rele(&pair->ref);
				}
				if (spipe != NULL) {
					nni_pipe_close(spipe->pipe);
					nni_pipe_rele(spipe->pipe);
				} else {
					nni_refcnt_rele(&pair->ref);
				}
				inproc_conn_finish(caio, rv, cli, NULL);
				inproc_conn_finish(saio, rv, srv, NULL);
				continue;
			}

			cpipe->proto      = cli->proto;
			cpipe->addr       = cli->addr;
			spipe->proto      = srv->proto;
			spipe->addr       = srv->addr;
			cpipe->peer       = spipe->proto;
			spipe->peer       = cpipe->proto;
			cpipe->pair       = pair;
			spipe->pair       = pair;
			cpipe->send_queue = &pair->queues[0];
			cpipe->recv_queue = &pair->queues[1];
			spipe->send_queue = &pair->queues[1];
			spipe->recv_queue = &pair->queues[0];

			inproc_conn_finish(caio, 0, cli, cpipe);
			inproc_conn_finish(saio, 0, srv, spipe);
		}

		if (nni_list_first(&cli->aios) == NULL) {
			// No more outstanding client connects.
			// Normally there should only be one.
			if (nni_list_active(&srv->clients, cli)) {
				nni_list_remove(&srv->clients, cli);
			}
		}
	}
}